

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_parser.cpp
# Opt level: O3

void ParseScripts(void)

{
  hash_t hVar1;
  uint lump;
  int iVar2;
  yyParser_conflict *pParser_00;
  char *__filename;
  FILE *pFVar3;
  ZCCParseState *pZVar4;
  yyParser_conflict *pParser;
  ulong uVar5;
  long lVar6;
  ZCCToken yyminor;
  int lastlump;
  PSymbolTable symtable;
  ZCCCompiler cc;
  TokenMapEntry tme;
  FScanner sc;
  undefined1 local_a08 [16];
  undefined1 local_9f8 [32];
  undefined1 local_9d8 [104];
  ZCCParseState local_970;
  FScanner local_130;
  
  hVar1 = TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::CountUsed
                    (&TokenMap);
  if (hVar1 == 0) {
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 1;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[1] = 0x3d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 2;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x110,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[2] = 0x110;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 3;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x111,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[3] = 0x111;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 4;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x112,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[4] = 0x112;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 5;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[5] = 0x10e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 6;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[6] = 0x10f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 7;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[7] = 0x10d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 8;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[8] = 0x10b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0xc;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0xc] = 0x10c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 9;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x113,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[9] = 0x113;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 10;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x115,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[10] = 0x115;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0xb;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x114,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0xb] = 0x114;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0xd;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0xd] = 0x3f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0xe;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0xe] = 0x3a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0xf;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0xf] = 0x11c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x10;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x10] = 0x11b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x11;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x11] = 0x11f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x12;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x120,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x12] = 0x120;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x13;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x121,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x13] = 0x121;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x14;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x14] = 0x3c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x15;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x15] = 0x3e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x16;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x16] = 0x11d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x17;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x17] = 0x11e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x18;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x122,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x18] = 0x122;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x19;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x178,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x19] = 0x178;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x109,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1a] = 0x109;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x75;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x10a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x75] = 0x10a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1b] = 0x7c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1c] = 0x5e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x26,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1d] = 0x26;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x118,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1e] = 0x118;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x116,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x1f] = 0x116;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x20;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x117,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x20] = 0x117;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x21;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x21] = 0x2d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x22;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x22] = 0x2b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x23;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x23] = 0x2a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x24] = 0x2f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x25,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x25] = 0x25;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x26;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x167,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x26] = 0x167;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x27;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x166,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x27] = 0x166;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x28;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x123,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x28] = 0x123;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x119,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2a] = 0x119;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x11a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2b] = 0x11a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2c] = 0x2e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x28,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2d] = 0x28;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x43;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x29,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x43] = 0x29;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x108,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2f] = 0x108;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x31;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x3b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x31] = 0x3b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x32;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x2c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x32] = 0x2c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x35;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x146,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x35] = 0x146;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x37;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x37] = 0x14e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x38;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x158,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x38] = 0x158;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x39;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x125,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x39] = 0x125;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x3a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x179,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3a] = 0x179;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x6c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x15d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x6c] = 0x15d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x6d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x165,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x6d] = 0x165;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x6e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x164,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x6e] = 0x164;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x6f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x16a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x6f] = 0x16a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x73;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x171,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x73] = 0x171;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x74;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x172,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x74] = 0x172;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x70;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x160,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x70] = 0x160;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x71;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x185,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x71] = 0x185;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x72;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x186,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x72] = 0x186;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 99;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x187,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[99] = 0x187;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x3d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3d] = 0x7b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x3e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3e] = 0x7d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x3f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x145,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3f] = 0x145;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x41;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x147,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x41] = 0x147;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24a0053;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x139,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x53] = 0x139;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24b0054;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x138,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x54] = 0x138;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24c0055;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x55] = 0x13a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24d0056;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x56] = 0x13b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2520053;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x53] = 0x13c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2510054;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x54] = 0x13d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2540055;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x55] = 0x13e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2530056;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x13f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x56] = 0x13f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24e0057;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x140,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x57] = 0x140;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x24f0058;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x141,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x58] = 0x141;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2500059;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x133,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x59] = 0x133;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x255005a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x134,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5a] = 0x134;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x258005b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x136,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5b] = 0x136;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x259005c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x149,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5c] = 0x149;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x261005d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5d] = 0x17a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x262005e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5e] = 0x17b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x1ea005f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x148,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x5f] = 0x148;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25b0064;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[100] = 0x17c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25c0065;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x65] = 0x17d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25d0033;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x177,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x33] = 0x177;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x66;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x144,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x66] = 0x144;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x82;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x150,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x82] = 0x150;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x81;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x151,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x81] = 0x151;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x2e] = 0x5b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x6b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x5d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x6b] = 0x5d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x76;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x76] = 0x17e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x77;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x15a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x77] = 0x15a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x78;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x16f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x78] = 0x16f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x173,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4a] = 0x173;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x83;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x174,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x83] = 0x174;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x79;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x7e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x79] = 0x7e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x21,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7a] = 0x21;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x17f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7b] = 0x17f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x180,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7c] = 0x180;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x84;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x129,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x84] = 0x129;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x85;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x126,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x85] = 0x126;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x86;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12f,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x86] = 0x12f;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x87;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,299,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x87] = 299;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x88;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x88] = 0x12d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x89;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x132,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x89] = 0x132;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x8a;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x131,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x8a] = 0x131;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x8b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x8b] = 0x12e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x8c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,300,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x8c] = 300;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x8d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x130,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x8d] = 0x130;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x8e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x127,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x8e] = 0x127;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x249003b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x12a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3b] = 0x12a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x40;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x128,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x40] = 0x128;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x45;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x176,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x45] = 0x176;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x46;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x184,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x46] = 0x184;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x47;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x183,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x47] = 0x183;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x48;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x182,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x48] = 0x182;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x49;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x49] = 0x14d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x42;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x181,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x42] = 0x181;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25f0061;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x61] = 0x14b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x204003c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x3c] = 0x14c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x25e0060;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x14a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x60] = 0x14a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x2630062;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,399,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x62] = 399;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x36;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x101,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x36] = 0x101;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x52;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x102,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x52] = 0x102;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x80;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x103,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x80] = 0x103;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x104,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7d] = 0x104;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x105,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7e] = 0x105;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x7f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x106,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x7f] = 0x106;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x44;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x107,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x44] = 0x107;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4b;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18e,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4b] = 0x18e;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4d;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18d,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4d] = 0x18d;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4c;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x189,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4c] = 0x189;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4e;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18b,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4e] = 0x18b;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x50;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18c,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x50] = 0x18c;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x4f;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x188,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x4f] = 0x188;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x51;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x18a,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x51] = 0x18a;
    local_970.super_ZCC_AST.Strings.super_FMemArena.TopBlock._0_4_ = 0x34;
    TMap<short,_TokenMapEntry,_THashTraits<short>,_TValueTraits<TokenMapEntry>_>::Insert
              (&TokenMap,0x162,(TokenMapEntry *)(local_9d8 + 0x68));
    BackTokenMap[0x34] = 0x162;
  }
  ZCC_InitOperators();
  ZCC_InitConversions();
  local_a08._12_4_ = 0;
  FScriptPosition::WarnCounter = 0;
  FScriptPosition::ErrorCounter = 0;
  do {
    pZVar4 = (ZCCParseState *)0x0;
    lump = FWadCollection::FindLump(&Wads,"ZSCRIPT",(int *)(local_a08 + 0xc),false);
    if (lump == 0xffffffff) {
      Printf("\x1cTWARNING!!!\n");
      Printf(
            "\x1cTAs of this version, Zscript is still considered a feature in development which can change \x1cGWITHOUT WARNING!!!\n"
            );
      Printf("\x1cTUse at your own risk!\n");
      return;
    }
    FScanner::FScanner(&local_130);
    pParser_00 = (yyParser_conflict *)malloc(0x12d8);
    if (pParser_00 != (yyParser_conflict *)0x0) {
      pParser_00->yyerrcnt = -1;
      pParser_00->yytos = pParser_00->yystack;
      pParser_00->yystack[0].stateno = 0;
      pParser_00->yystack[0].major = '\0';
    }
    ZCC_AST::ZCC_AST((ZCC_AST *)(local_9d8 + 0x68));
    local_970.sc = (FScanner *)0x0;
    __filename = DArgs::CheckValue(Args,"-tracefile");
    if (__filename == (char *)0x0) {
      pFVar3 = (FILE *)0x0;
    }
    else {
      pFVar3 = fopen(__filename,"w");
      pZVar4 = (ZCCParseState *)local_9d8;
      yyTraceFILE = (FILE *)pFVar3;
      yyTracePrompt = (char *)pFVar3;
      if (pFVar3 != (FILE *)0x0) {
        yyTracePrompt = (char *)pZVar4;
      }
    }
    FScanner::OpenLumpNum(&local_130,lump);
    FScanner::SavePos(&local_130);
    ParseSingleFile((char *)(ulong)lump,(int)pParser_00,local_9d8 + 0x68,pZVar4);
    if (Includes.Count != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pZVar4 = (ZCCParseState *)0x0;
        lump = FWadCollection::CheckNumForFullName(&Wads,Includes.Array[uVar5].Chars,true,0);
        if (lump == 0xffffffff) {
          FScriptPosition::Message
                    ((FScriptPosition *)((long)&((IncludeLocs.Array)->FileName).Chars + lVar6),2,
                     "Include script lump %s not found");
        }
        else {
          ParseSingleFile((char *)(ulong)lump,(int)pParser_00,local_9d8 + 0x68,pZVar4);
        }
        uVar5 = uVar5 + 1;
        lVar6 = lVar6 + 0x10;
      } while (uVar5 < Includes.Count);
      if (Includes.Count != 0) {
        TArray<FString,_FString>::DoDelete(&Includes,0,Includes.Count - 1);
        Includes.Count = 0;
      }
    }
    TArray<FString,_FString>::ShrinkToFit(&Includes);
    if (IncludeLocs.Count != 0) {
      TArray<FScriptPosition,_FScriptPosition>::DoDelete(&IncludeLocs,0,IncludeLocs.Count - 1);
      IncludeLocs.Count = 0;
    }
    TArray<FScriptPosition,_FScriptPosition>::ShrinkToFit(&IncludeLocs);
    iVar2 = FScanner::GetMessageLine(&local_130);
    yyminor.SourceLoc = iVar2;
    yyminor.field_0.Float = 2.12199579047121e-314;
    yyminor._12_4_ = 0;
    ZCCParse(pParser_00,0,yyminor,(ZCCParseState *)(local_9d8 + 0x68));
    if (pParser_00 != (yyParser_conflict *)0x0) {
      while (pParser_00->yystack < pParser_00->yytos) {
        yy_pop_parser_stack(pParser_00);
      }
      free(pParser_00);
    }
    iVar2 = FScriptPosition::ErrorCounter;
    if (0 < FScriptPosition::ErrorCounter) {
      FWadCollection::GetLumpFullPath((FWadCollection *)local_9d8,0x1c70340);
      I_Error("%d errors while parsing %s",(ulong)(uint)iVar2,local_9d8._0_8_);
      FString::~FString((FString *)local_9d8);
    }
    if (pFVar3 != (FILE *)0x0) {
      fclose(pFVar3);
    }
    iVar2 = DArgs::CheckParm(Args,"-dumpast",1);
    if (iVar2 != 0) {
      ZCC_PrintAST((ZCC_TreeNode *)local_9d8);
      FWadCollection::GetLumpFullPath((FWadCollection *)local_9f8,0x1c70340);
      FString::ReplaceChars((FString *)local_9f8,":\\/?|",'.');
      FString::operator+=((FString *)local_9f8,".ast");
      pFVar3 = fopen((char *)local_9f8._0_8_,"w");
      if (pFVar3 != (FILE *)0x0) {
        fputs((char *)local_9d8._0_8_,pFVar3);
        fclose(pFVar3);
      }
      FString::~FString((FString *)local_9f8);
      FString::~FString((FString *)local_9d8);
    }
    PSymbolTable::PSymbolTable((PSymbolTable *)local_9f8);
    ZCCCompiler::ZCCCompiler
              ((ZCCCompiler *)local_9d8,(ZCC_AST *)(local_9d8 + 0x68),(DObject *)0x0,
               (PSymbolTable *)local_9f8,&GlobalSymbols,lump);
    ZCCCompiler::Compile((ZCCCompiler *)local_9d8);
    iVar2 = FScriptPosition::WarnCounter;
    uVar5 = (ulong)(uint)FScriptPosition::ErrorCounter;
    if (FScriptPosition::ErrorCounter < 1) {
      if (0 < FScriptPosition::WarnCounter) {
        FWadCollection::GetLumpFullPath((FWadCollection *)local_a08,0x1c70340);
        Printf("\x1cI%d warnings while compiling %s",(ulong)(uint)iVar2,local_a08._0_8_);
        goto LAB_00566530;
      }
    }
    else {
      FWadCollection::GetLumpFullPath((FWadCollection *)local_a08,0x1c70340);
      I_Error("%d errors, %d warnings while compiling %s",uVar5,(ulong)(uint)iVar2);
LAB_00566530:
      FString::~FString((FString *)local_a08);
    }
    ZCCCompiler::~ZCCCompiler((ZCCCompiler *)local_9d8);
    PSymbolTable::~PSymbolTable((PSymbolTable *)local_9f8);
    FMemArena::~FMemArena(&local_970.super_ZCC_AST.SyntaxArena);
    FSharedStringArena::~FSharedStringArena((FSharedStringArena *)(local_9d8 + 0x68));
    FScanner::~FScanner(&local_130);
    iVar2 = DArgs::CheckParm(Args,"-zscript",1);
    if (iVar2 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void ParseScripts()
{
	if (TokenMap.CountUsed() == 0)
	{
		InitTokenMap();
	}
	ZCC_InitOperators();
	ZCC_InitConversions();

	int lump, lastlump = 0;
	FScriptPosition::ResetErrorCounter();

	while ((lump = Wads.FindLump("ZSCRIPT", &lastlump)) != -1)
	{
		DoParse(lump);
		if (!Args->CheckParm("-zscript"))
		{
			return;
		}
	}
	Printf(TEXTCOLOR_PURPLE "WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "As of this version, Zscript is still considered a feature in development which can change " TEXTCOLOR_RED "WITHOUT WARNING!!!\n");
	Printf(TEXTCOLOR_PURPLE "Use at your own risk!\n");

}